

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colWord.c
# Opt level: O1

void Col_WordAddSynonym(Col_Word *wordPtr,Col_Word synonym)

{
  Col_Word *pCVar1;
  Col_Word CVar2;
  int iVar3;
  Col_Word *pCVar4;
  Col_Word *pCVar5;
  Col_Word word;
  Col_Word local_28;
  
  CVar2 = *wordPtr;
  if (synonym == 0 || CVar2 == 0) {
    return;
  }
  local_28 = synonym;
  iVar3 = HasSynonymField(CVar2);
  word = CVar2;
  if (iVar3 == 0) {
    AddSynonymField(wordPtr);
  }
  else {
    do {
      if (word == synonym) {
        return;
      }
      iVar3 = HasSynonymField(word);
    } while ((iVar3 != 0) && (pCVar1 = (Col_Word *)(word + 8), word = *pCVar1, *pCVar1 != CVar2));
  }
  CVar2 = *wordPtr;
  iVar3 = HasSynonymField(synonym);
  if (iVar3 == 0) {
    if (*(long *)(CVar2 + 8) == 0) {
      *(Col_Word *)(CVar2 + 8) = synonym;
      return;
    }
    AddSynonymField(&local_28);
  }
  pCVar1 = (Col_Word *)(CVar2 + 8);
  pCVar4 = pCVar1;
  if (*(Col_Word *)(CVar2 + 8) == 0) {
LAB_0010d411:
    *pCVar4 = CVar2;
  }
  else {
    iVar3 = HasSynonymField(*(Col_Word *)(CVar2 + 8));
    if (iVar3 == 0) {
      AddSynonymField(pCVar1);
      pCVar4 = (Col_Word *)(*pCVar1 + 8);
      goto LAB_0010d411;
    }
  }
  CVar2 = local_28;
  pCVar4 = (Col_Word *)(local_28 + 8);
  pCVar5 = pCVar4;
  if (*(Col_Word *)(local_28 + 8) != 0) {
    iVar3 = HasSynonymField(*(Col_Word *)(local_28 + 8));
    if (iVar3 != 0) goto LAB_0010d443;
    AddSynonymField(pCVar4);
    pCVar5 = (Col_Word *)(*pCVar4 + 8);
  }
  *pCVar5 = CVar2;
LAB_0010d443:
  CVar2 = *pCVar1;
  *pCVar1 = *pCVar4;
  *pCVar4 = CVar2;
  return;
}

Assistant:

void
Col_WordAddSynonym(
    Col_Word *wordPtr,  /*!< Point to the word to add synonym to. May be
                             modified in the process (in this case the original
                             word will be part of the returned word's synonym
                             chain). */
    Col_Word synonym)   /*!< The synonym to add. */
{
    Col_Word word;

    /*
     * Quick cases.
     */

    if (!*wordPtr || !synonym) {
        /*
         * Nil can't have synonyms.
         */

        return;
    }

    if (!HasSynonymField(*wordPtr)) {
        AddSynonymField(wordPtr);
    } else {
        /*
         * Ensure that synonym is not already part of word's chain.
         */

        word = *wordPtr;
        do {
            if (word == synonym) return;
            if (!HasSynonymField(word)) break;
            word = WORD_SYNONYM(word);
        } while (word != *wordPtr);
    }
    word = *wordPtr;

    if (!HasSynonymField(synonym)) {
        if (!WORD_SYNONYM(word)) {
            /*
             * Word has no current synonym, simply add the new one without
             * wrapping the synonym.
             */

            WORD_SYNONYM(word) = synonym;
            return;
        }
        AddSynonymField(&synonym);
    }

    /*
     * Synonym-less words have a nil synonym pointer. Words with one synonym
     * without synonym field itself simply point to it. Larger synonym chains
     * must be circular lists of words with synonym fields. Here, ensure that
     * both word and synonym's synonym chains are circular lists.
     */

    ASSERT(HasSynonymField(word));
    ASSERT(HasSynonymField(synonym));
    if (!WORD_SYNONYM(word)) {
        WORD_SYNONYM(word) = word;
    } else if (!HasSynonymField(WORD_SYNONYM(word))) {
        AddSynonymField(&WORD_SYNONYM(word));
        WORD_SYNONYM(WORD_SYNONYM(word)) = word;
    }
    if (!WORD_SYNONYM(synonym)) {
        WORD_SYNONYM(synonym) = synonym;
    } else if (!HasSynonymField(WORD_SYNONYM(synonym))) {
        AddSynonymField(&WORD_SYNONYM(synonym));
        WORD_SYNONYM(WORD_SYNONYM(synonym)) = synonym;
    }

    /*
     * Merging circular lists is simply done by exchanging the heads' next
     * pointers.
     */

    {
        Col_Word tmp = WORD_SYNONYM(word);
        WORD_SYNONYM(word) = WORD_SYNONYM(synonym);
        WORD_SYNONYM(synonym) = tmp;
    }
}